

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O3

void __thiscall libtorrent::natpmp::on_reply(natpmp *this,error_code *e,size_t bytes_transferred)

{
  endpoint *this_00;
  implementation_type *impl;
  byte bVar1;
  service_type *psVar2;
  pointer pmVar3;
  bool bVar4;
  int iVar5;
  port_mapping_t i;
  uint uVar6;
  char *pcVar7;
  time_point tVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  address *paVar12;
  uint uVar13;
  int iVar14;
  endpoint *ep;
  address *addr;
  ushort uVar15;
  undefined1 *puVar16;
  portmap_callback *ppVar17;
  portmap_protocol pVar18;
  _func_int **pp_Var19;
  pointer pmVar20;
  ushort uVar21;
  ulong uVar22;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar23;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  address external_addr;
  array<char,_12UL> nonce;
  long local_598;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_590;
  undefined8 local_588;
  unsigned_long uStack_580;
  ulong local_570;
  error_code local_568;
  undefined8 local_558;
  undefined8 uStack_550;
  char msg [200];
  array<char,_1100UL> msg_buf;
  
  if (e->failed_ == true) {
    iVar5 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,0);
    if ((char)iVar5 == '\0') {
      return;
    }
    (*e->cat_->_vptr_error_category[4])(&msg_buf,e->cat_,(ulong)(uint)e->val_);
    log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    puVar16 = (undefined1 *)
              CONCAT44(msg_buf._M_elems._4_4_,
                       CONCAT13(msg_buf._M_elems[3],
                                CONCAT12(msg_buf._M_elems[2],
                                         CONCAT11(msg_buf._M_elems[1],msg_buf._M_elems[0]))));
    if (puVar16 == msg_buf._M_elems + 0x10) {
      return;
    }
  }
  else {
    if (this->m_abort != false) {
      return;
    }
    memcpy(&msg_buf,this->m_response_buffer,bytes_transferred);
    external_addr.ipv6_address_.addr_.__in6_u._0_8_ = 0x44c;
    this_00 = &this->m_remote;
    external_addr._0_8_ = this->m_response_buffer;
    ::std::__shared_ptr<libtorrent::natpmp,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::natpmp,void>
              ((__shared_ptr<libtorrent::natpmp,(__gnu_cxx::_Lock_policy)2> *)&local_598,
               (__weak_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2> *)this);
    msg._0_8_ = on_reply;
    msg[8] = '\0';
    msg[9] = '\0';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = (undefined1)local_598;
    msg[0x11] = local_598._1_1_;
    msg[0x12] = local_598._2_1_;
    msg[0x13] = local_598._3_1_;
    msg[0x14] = local_598._4_1_;
    msg[0x15] = local_598._5_1_;
    msg[0x16] = local_598._6_1_;
    msg[0x17] = local_598._7_1_;
    msg._24_8_ = p_Stack_590;
    local_598 = 0;
    p_Stack_590 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    impl = &(this->m_socket).
            super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            .
            super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            .impl_.implementation_;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>::
    async_receive_from<boost::asio::mutable_buffer,std::_Bind<void(libtorrent::natpmp::*(std::shared_ptr<libtorrent::natpmp>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              ((this->m_socket).
               super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .
               super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .impl_.service_,impl,(mutable_buffer *)&external_addr,this_00,0,
               (_Bind<void_(libtorrent::natpmp::*(std::shared_ptr<libtorrent::natpmp>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>
                *)msg,&(this->m_socket).
                       super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       .
                       super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       .impl_.executor_);
    if (msg._24_8_ != 0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._24_8_);
    }
    if (p_Stack_590 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_590);
    }
    bVar4 = boost::asio::ip::operator==(this_00,&this->m_nat_endpoint);
    if (bVar4) {
      uVar23 = extraout_XMM0_Da_00;
      uVar24 = extraout_XMM0_Db_00;
      if ((this->m_send_timer).impl_.implementation_.might_have_pending_waits == true) {
        psVar2 = (this->m_send_timer).impl_.service_;
        boost::asio::detail::epoll_reactor::
        cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                  (psVar2->scheduler_,&psVar2->timer_queue_,
                   &(this->m_send_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
        (this->m_send_timer).impl_.implementation_.might_have_pending_waits = false;
        uVar23 = extraout_XMM0_Da_01;
        uVar24 = extraout_XMM0_Db_01;
      }
      if ((bytes_transferred < 4) || ((msg_buf._M_elems[0] & 0xfdU) != 0)) {
LAB_00232470:
        log(this,(double)CONCAT44(uVar24,uVar23));
        return;
      }
      if (msg_buf._M_elems[0] == '\x02') {
        uVar13 = (uint)(byte)msg_buf._M_elems[3];
      }
      else {
        uVar13 = (uint)(ushort)(CONCAT11(msg_buf._M_elems[3],msg_buf._M_elems[2]) << 8 |
                               (ushort)(byte)msg_buf._M_elems[3]);
      }
      if (uVar13 == 1) {
        log(this,(double)CONCAT44(uVar24,uVar23));
        external_addr._0_8_ = external_addr._0_8_ & 0xffffff0000000000;
        external_addr.ipv6_address_.addr_.__in6_u._0_8_ =
             &boost::system::detail::cat_holder<void>::system_category_instance;
        if (this->m_version != version_pcp) {
          return;
        }
        boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>::local_endpoint
                  ((endpoint_type *)msg,
                   (this->m_socket).
                   super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   .
                   super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   .impl_.service_,impl,(error_code *)&external_addr);
        if (msg._0_2_ != 2) {
          return;
        }
        this->m_version = version_natpmp;
        resend_request(this,(port_mapping_t)(this->m_currently_mapping).m_val);
        send_get_ip_address_request(this);
        return;
      }
      if ((bytes_transferred < 0xc && msg_buf._M_elems[0] == '\0') ||
         (bytes_transferred < 0x18 && msg_buf._M_elems[0] == '\x02')) goto LAB_00232470;
      uVar6 = (uint)(byte)msg_buf._M_elems[0];
      if (msg_buf._M_elems[0] == '\x02') {
        lVar9 = 0;
        uVar11 = 0;
        do {
          uVar11 = (ulong)((uint)(byte)msg_buf._M_elems[lVar9 + 4] | (int)uVar11 << 8);
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 != 4);
        if (bytes_transferred == 0x3c) {
          pcVar10 = msg_buf._M_elems + 0x28;
          nonce._M_elems[8] = msg_buf._M_elems[0x20];
          nonce._M_elems[9] = msg_buf._M_elems[0x21];
          nonce._M_elems[10] = msg_buf._M_elems[0x22];
          nonce._M_elems[0xb] = msg_buf._M_elems[0x23];
          nonce._M_elems[0] = msg_buf._M_elems[0x18];
          nonce._M_elems[1] = msg_buf._M_elems[0x19];
          nonce._M_elems[2] = msg_buf._M_elems[0x1a];
          nonce._M_elems[3] = msg_buf._M_elems[0x1b];
          nonce._M_elems[4] = msg_buf._M_elems[0x1c];
          nonce._M_elems[5] = msg_buf._M_elems[0x1d];
          nonce._M_elems[6] = msg_buf._M_elems[0x1e];
          nonce._M_elems[7] = msg_buf._M_elems[0x1f];
          pVar18 = udp - (msg_buf._M_elems[0x24] == '\x06');
LAB_00232684:
          pcVar7 = pcVar10 + 4;
          if (uVar6 == 0) {
            lVar9 = 0;
            uVar11 = 0;
            do {
              uVar11 = (ulong)((uint)(byte)pcVar7[lVar9] | (int)uVar11 << 8);
              lVar9 = lVar9 + 1;
            } while ((int)lVar9 != 4);
            pcVar7 = pcVar10 + 8;
          }
          uVar21 = *(ushort *)pcVar10 << 8 | *(ushort *)pcVar10 >> 8;
          uVar15 = *(ushort *)(pcVar10 + 2) << 8 | *(ushort *)(pcVar10 + 2) >> 8;
          external_addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          external_addr.ipv6_address_.scope_id_ = 0;
          external_addr.type_ = ipv4;
          external_addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
          external_addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
          if (msg_buf._M_elems[0] == '\x02') {
            lVar9 = 0;
            do {
              *(char *)((long)&local_558 + lVar9) = pcVar7[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x10);
            external_addr.type_ = ipv6;
            external_addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
            external_addr.ipv6_address_.addr_.__in6_u._0_8_ = local_558;
            external_addr.ipv6_address_.addr_.__in6_u._8_8_ = uStack_550;
            external_addr.ipv6_address_.scope_id_ = 0;
            boost::asio::ip::address::to_v6((address_v6 *)msg,&external_addr);
            bVar4 = boost::asio::ip::address_v6::is_v4_mapped((address_v6 *)msg);
            if (bVar4) {
              boost::asio::ip::address::to_v6((address_v6 *)msg,&external_addr);
              boost::asio::ip::make_address_v4((ip *)&local_598,v4_mapped,(address_v6 *)msg);
              external_addr._0_8_ = local_598 << 0x20;
              external_addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
              external_addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
              external_addr.ipv6_address_.scope_id_ = 0;
            }
          }
          local_570 = (ulong)uVar15;
          if (uVar6 == 0) {
            pVar18 = (msg_buf._M_elems[1] == -0x7f) + tcp;
            pcVar10 = "NAT-PMP";
          }
          else {
            pcVar10 = "PCP";
          }
          pcVar7 = "tcp";
          if (pVar18 == udp) {
            pcVar7 = "udp";
          }
          iVar5 = snprintf(msg,200,
                           "<== port map [ transport: %s protocol: %s local: %d external: %d ttl: %d ]"
                           ,pcVar10,pcVar7,(ulong)uVar21,local_570,uVar11);
          pmVar20 = (this->m_mappings).
                    super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                    .
                    super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pmVar3 = (this->m_mappings).
                   super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                   .
                   super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pmVar20 != pmVar3) {
            uVar22 = 0;
            do {
              if (((((pmVar20->local_port == (uint)uVar21) &&
                    (pVar18 == (pmVar20->super_base_mapping).protocol)) &&
                   (pmVar20->map_sent == true)) && (pmVar20->outstanding_request == true)) &&
                 ((msg_buf._M_elems[0] != '\x02' ||
                  (nonce._M_elems._8_4_ == *(int *)&pmVar20->field_0x19 &&
                   nonce._M_elems._0_8_ == *(long *)&(pmVar20->super_base_mapping).field_0x11)))) {
                pmVar20->outstanding_request = false;
                log(this,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
                if ((uVar15 == 0) || (iVar5 = (int)uVar11, iVar5 == 0)) {
                  (pmVar20->super_base_mapping).protocol = none;
                }
                else {
                  tVar8 = aux::time_now();
                  iVar14 = iVar5 * 3 + 3;
                  if (-1 < iVar5 * 3) {
                    iVar14 = iVar5 * 3;
                  }
                  (pmVar20->super_base_mapping).expires.__d.__r =
                       (long)(iVar14 >> 2) * 1000000000 + (long)tVar8.__d.__r;
                  (pmVar20->super_base_mapping).external_port = (int)local_570;
                  bVar4 = boost::asio::ip::address::is_unspecified(&external_addr);
                  if (!bVar4) {
                    (pmVar20->external_address).type_ = external_addr.type_;
                    (pmVar20->external_address).ipv4_address_ =
                         (address_v4)external_addr.ipv4_address_.addr_.s_addr;
                    *(undefined8 *)&(pmVar20->external_address).ipv6_address_.addr_.__in6_u =
                         external_addr.ipv6_address_.addr_.__in6_u._0_8_;
                    *(undefined8 *)
                     ((long)&(pmVar20->external_address).ipv6_address_.addr_.__in6_u + 8) =
                         external_addr.ipv6_address_.addr_.__in6_u._8_8_;
                    (pmVar20->external_address).ipv6_address_.scope_id_ =
                         external_addr.ipv6_address_.scope_id_;
                  }
                }
                i.m_val = (int)(uVar22 >> 3) * 0x38e38e39;
                if (uVar13 == 0) {
                  if ((pmVar20->super_base_mapping).act != add) goto LAB_00232a85;
                  pVar18 = (pmVar20->super_base_mapping).protocol;
                  paVar12 = &this->m_external_ip;
                  if (msg_buf._M_elems[0] == '\x02') {
                    paVar12 = &pmVar20->external_address;
                  }
                  local_598._0_4_ = paVar12->type_;
                  local_598._4_4_ = paVar12->ipv4_address_;
                  p_Stack_590 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                 &(paVar12->ipv6_address_).addr_.__in6_u;
                  local_588 = *(undefined8 *)((long)&(paVar12->ipv6_address_).addr_.__in6_u + 8);
                  uStack_580 = (paVar12->ipv6_address_).scope_id_;
                  ppVar17 = this->m_callback;
                  uVar13 = (pmVar20->super_base_mapping).external_port;
                  lVar9 = 0;
                  if ((pcp_category::pcp_category.super_error_category.id_ != 0x8fafd21e25c5e09b) &&
                     (pcp_category::pcp_category.super_error_category.id_ != 0xb2ab117a257edf0d)) {
                    uVar6 = (*pcp_category::pcp_category.super_error_category._vptr_error_category
                              [6])(&pcp_category::pcp_category,0);
                    lVar9 = (ulong)(uVar6 & 0xff) << 0x20;
                  }
                  local_568.cat_ = &pcp_category::pcp_category.super_error_category;
                  local_568.val_ = (int)lVar9;
                  local_568.failed_ = (bool)(char)((ulong)lVar9 >> 0x20);
                  local_568._5_3_ = (int3)((ulong)lVar9 >> 0x28);
                  pp_Var19 = ppVar17->_vptr_portmap_callback;
                  uVar11 = (ulong)uVar13;
                }
                else {
                  tVar8 = aux::time_now();
                  (pmVar20->super_base_mapping).expires.__d.__r =
                       (long)tVar8.__d.__r + 7200000000000;
                  pVar18 = (pmVar20->super_base_mapping).protocol;
                  ppVar17 = this->m_callback;
                  local_588 = 0;
                  uStack_580 = 0;
                  local_598 = 0;
                  p_Stack_590 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_568 = from_result_code(uVar6,uVar13);
                  pp_Var19 = ppVar17->_vptr_portmap_callback;
                  uVar11 = 0;
                }
                (**pp_Var19)(ppVar17,(ulong)(uint)i.m_val,&local_598,uVar11,(ulong)pVar18,&local_568
                             ,0,&this->m_listen_handle);
LAB_00232a85:
                (this->m_currently_mapping).m_val = -1;
                (pmVar20->super_base_mapping).act = none;
                if ((this->m_send_timer).impl_.implementation_.might_have_pending_waits == true) {
                  psVar2 = (this->m_send_timer).impl_.service_;
                  boost::asio::detail::epoll_reactor::
                  cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                            (psVar2->scheduler_,&psVar2->timer_queue_,
                             &(this->m_send_timer).impl_.implementation_.timer_data,
                             0xffffffffffffffff);
                  (this->m_send_timer).impl_.implementation_.might_have_pending_waits = false;
                }
                update_expiration_timer(this);
                try_next_mapping(this,i);
                return;
              }
              pmVar20 = pmVar20 + 1;
              uVar22 = uVar22 + 0x48;
            } while (pmVar20 != pmVar3);
          }
          snprintf(msg + iVar5,200 - (long)iVar5," not found in map table");
          log(this,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
          return;
        }
        goto LAB_00232470;
      }
      pcVar10 = msg_buf._M_elems + 8;
      uVar11 = 0;
      if (msg_buf._M_elems[1] != -0x80 || msg_buf._M_elems[0] != '\0') {
        if (bytes_transferred == 0x10 || msg_buf._M_elems[0] != '\0') {
          pVar18 = none;
          goto LAB_00232684;
        }
        goto LAB_00232470;
      }
      lVar9 = 0;
      uVar13 = 0;
      do {
        uVar6 = uVar13 << 8;
        bVar1 = pcVar10[lVar9];
        uVar13 = bVar1 | uVar6;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 4);
      (this->m_external_ip).type_ = ipv4;
      (this->m_external_ip).ipv4_address_.addr_.s_addr =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | (uint)bVar1 << 0x18;
      *(undefined8 *)&(this->m_external_ip).ipv6_address_.addr_.__in6_u = 0;
      *(undefined8 *)((long)&(this->m_external_ip).ipv6_address_.addr_.__in6_u + 8) = 0;
      (this->m_external_ip).ipv6_address_.scope_id_ = 0;
      iVar5 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,0);
      if ((char)iVar5 == '\0') {
        return;
      }
      aux::print_address_abi_cxx11_((string *)msg,(aux *)&this->m_external_ip,addr);
      log(this,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
    }
    else {
      iVar5 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,0);
      if ((char)iVar5 == '\0') {
        return;
      }
      aux::print_endpoint_abi_cxx11_((string *)msg,(aux *)this_00,ep);
      log(this,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
    }
    msg_buf._M_elems._16_8_ = msg._16_8_;
    puVar16 = (undefined1 *)msg._0_8_;
    if ((char *)msg._0_8_ == msg + 0x10) {
      return;
    }
  }
  operator_delete(puVar16,msg_buf._M_elems._16_8_ + 1);
  return;
}

Assistant:

void natpmp::on_reply(error_code const& e
	, std::size_t const bytes_transferred)
{
	TORRENT_ASSERT(is_single_thread());

	COMPLETE_ASYNC("natpmp::on_reply");

	using namespace libtorrent::aux;
	if (e)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error on receiving reply: %s"
				, e.message().c_str());
		}
#endif
		return;
	}

	if (m_abort) return;

	ADD_OUTSTANDING_ASYNC("natpmp::on_reply");
	// make a copy of the response packet buffer
	// to avoid overwriting it in the next receive call
	std::array<char, sizeof(m_response_buffer)> msg_buf;
	std::memcpy(msg_buf.data(), m_response_buffer, bytes_transferred);

	m_socket.async_receive_from(boost::asio::buffer(&m_response_buffer[0]
		, sizeof(m_response_buffer))
		, m_remote, std::bind(&natpmp::on_reply, self(), _1, _2));

	if (m_remote != m_nat_endpoint)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("received packet from wrong IP: %s"
				, print_endpoint(m_remote).c_str());
		}
#endif
		return;
	}

	m_send_timer.cancel();

	if (bytes_transferred < 4)
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("received packet of invalid size: %d", int(bytes_transferred));
#endif
		return;
	}

	char* in = msg_buf.data();
	int const version = read_uint8(in);

	if (version != version_natpmp && version != version_pcp)
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("unexpected version: %u", version);
#endif
		return;
	}

	std::uint8_t cmd = read_uint8(in);
	if (version == version_pcp)
	{
		cmd &= 0x7fu;
	}
	int result;
	if (version == version_pcp)
	{
		++in; // reserved
		result = read_uint8(in);
	}
	else
	{
		result = read_uint16(in);
	}

	if (result == errors::pcp_unsupp_version)
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("unsupported version");
#endif
		// ignore errors from local_endpoint
		error_code ec;
		if (m_version == version_pcp && !aux::is_v6(m_socket.local_endpoint(ec)))
		{
			m_version = version_natpmp;
			resend_request(m_currently_mapping);
			send_get_ip_address_request();
		}
		return;
	}

	if ((version == version_natpmp && bytes_transferred < 12)
		|| (version == version_pcp && bytes_transferred < 24))
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("received packet of invalid size: %d", int(bytes_transferred));
#endif
		return;
	}

	int lifetime = 0;
	if (version == version_pcp)
	{
		lifetime = aux::numeric_cast<int>(read_uint32(in));
	}
	int const time = aux::numeric_cast<int>(read_uint32(in));
	if (version == version_pcp) in += 12; // reserved
	TORRENT_UNUSED(time);

	if (version == version_natpmp && cmd == 0x80)
	{
		// public IP request response
		m_external_ip = read_v4_address(in);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("<== public IP address [ %s ]", print_address(m_external_ip).c_str());
		}
#endif
		return;

	}

	if ((version == version_natpmp && bytes_transferred != 16)
		|| (version == version_pcp && bytes_transferred != 60))
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("received packet of invalid size: %d", int(bytes_transferred));
#endif
		return;
	}

	std::array<char, 12> nonce;
	portmap_protocol protocol = portmap_protocol::none;
	if (version == version_pcp)
	{
		std::memcpy(nonce.data(), in, nonce.size());
		in += nonce.size();
		int p = read_uint8(in);
		protocol = p == 6 ? portmap_protocol::tcp
			: portmap_protocol::udp;
		in += 3; // reserved
	}
	int const private_port = read_uint16(in);
	int const public_port = read_uint16(in);
	if (version == version_natpmp)
		lifetime = aux::numeric_cast<int>(read_uint32(in));
	address external_addr;
	if (version == version_pcp)
	{
		external_addr = read_v6_address(in);
		if (external_addr.to_v6().is_v4_mapped())
			external_addr = make_address_v4(v4_mapped, external_addr.to_v6());
	}

	if (version == version_natpmp)
	{
		protocol = (cmd - 128 == 1)
			? portmap_protocol::udp
			: portmap_protocol::tcp;
	}

#ifndef TORRENT_DISABLE_LOGGING
	char msg[200];
	int const num_chars = std::snprintf(msg, sizeof(msg), "<== port map ["
		" transport: %s protocol: %s local: %d external: %d ttl: %d ]"
		, version_to_string(protocol_version(version))
		, (protocol == portmap_protocol::udp ? "udp" : "tcp")
		, private_port, public_port, lifetime);
#endif

	mapping_t* m = nullptr;
	port_mapping_t index{-1};
	for (auto i = m_mappings.begin(), end(m_mappings.end()); i != end; ++i)
	{
		if (private_port != i->local_port) continue;
		if (protocol != i->protocol) continue;
		if (!i->map_sent) continue;
		if (!i->outstanding_request) continue;
		if (version == version_pcp && nonce != i->nonce) continue;
		m = &*i;
		index = port_mapping_t(static_cast<int>(i - m_mappings.begin()));
		break;
	}

	if (m == nullptr)
	{
#ifndef TORRENT_DISABLE_LOGGING
		snprintf(msg + num_chars, sizeof(msg) - aux::numeric_cast<std::size_t>(num_chars), " not found in map table");
		log("%s", msg);
#endif
		return;
	}
	m->outstanding_request = false;

#ifndef TORRENT_DISABLE_LOGGING
	log("%s", msg);
#endif

	if (public_port == 0 || lifetime == 0)
	{
		// this means the mapping was
		// successfully closed
		m->protocol = portmap_protocol::none;
	}
	else
	{
		m->expires = aux::time_now() + seconds(lifetime * 3 / 4);
		m->external_port = public_port;
		if (!external_addr.is_unspecified())
			m->external_address = external_addr;
	}

	if (result != 0)
	{
		m->expires = aux::time_now() + hours(2);
		portmap_protocol const proto = m->protocol;
		m_callback.on_port_mapping(port_mapping_t{index}, address(), 0, proto
			, from_result_code(version, result), portmap_transport::natpmp, m_listen_handle);
	}
	else if (m->act == portmap_action::add)
	{
		portmap_protocol const proto = m->protocol;
		address const ext_ip = version == version_pcp ? m->external_address : m_external_ip;
		m_callback.on_port_mapping(port_mapping_t{index}, ext_ip, m->external_port, proto
			, errors::pcp_success, portmap_transport::natpmp, m_listen_handle);
	}

	m_currently_mapping = port_mapping_t{-1};
	m->act = portmap_action::none;
	m_send_timer.cancel();
	update_expiration_timer();
	try_next_mapping(index);
}